

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_set_offset(archive_write *a,int64_t off)

{
  void *pvVar1;
  int iVar2;
  size_t local_38;
  int64_t ext_bytes;
  int64_t used;
  iso9660_conflict *iso9660;
  int64_t off_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if (*(int *)((long)pvVar1 + 0x102e8) == 1) {
    ext_bytes = 0x10000 - *(long *)((long)pvVar1 + 0x102e0);
    if (*(long *)((long)pvVar1 + 0x10300) < *(long *)((long)pvVar1 + 0x102f0) + ext_bytes) {
      *(long *)((long)pvVar1 + 0x10300) = *(long *)((long)pvVar1 + 0x102f0) + ext_bytes;
    }
    if (*(long *)((long)pvVar1 + 0x102f0) < *(long *)((long)pvVar1 + 0x102f8)) {
      if ((0 < ext_bytes) &&
         (iVar2 = write_to_temp(a,(void *)((long)pvVar1 + 0x2dc),ext_bytes), iVar2 != 0)) {
        return -0x1e;
      }
      *(undefined8 *)((long)pvVar1 + 0x102f0) = *(undefined8 *)((long)pvVar1 + 0x102f8);
      lseek(*(int *)((long)pvVar1 + 8),*(__off_t *)((long)pvVar1 + 0x102f0),0);
      *(undefined8 *)((long)pvVar1 + 0x102e0) = 0x10000;
      ext_bytes = 0;
    }
    if (off < *(long *)((long)pvVar1 + 0x102f0)) {
      if ((0 < ext_bytes) && (iVar2 = wb_write_out(a), iVar2 != 0)) {
        return -0x1e;
      }
      lseek(*(int *)((long)pvVar1 + 8),off,0);
      *(int64_t *)((long)pvVar1 + 0x102f0) = off;
      *(undefined8 *)((long)pvVar1 + 0x102e0) = 0x10000;
    }
    else if (*(long *)((long)pvVar1 + 0x10300) < off) {
      *(long *)((long)pvVar1 + 0x102e0) =
           0x10000 - (*(long *)((long)pvVar1 + 0x10300) - *(long *)((long)pvVar1 + 0x102f0));
      for (local_38 = off - *(long *)((long)pvVar1 + 0x10300);
          *(long *)((long)pvVar1 + 0x102e0) <= (long)local_38;
          local_38 = local_38 - *(long *)((long)pvVar1 + 0x102e0)) {
        iVar2 = write_null(a,*(size_t *)((long)pvVar1 + 0x102e0));
        if (iVar2 != 0) {
          return -0x1e;
        }
      }
      if ((0 < (long)local_38) && (iVar2 = write_null(a,local_38), iVar2 != 0)) {
        return -0x1e;
      }
    }
    else {
      *(long *)((long)pvVar1 + 0x102e0) = 0x10000 - (off - *(long *)((long)pvVar1 + 0x102f0));
    }
    a_local._4_4_ = 0;
  }
  else {
    archive_set_error(&a->archive,-1,"Internal Programing error: iso9660:wb_set_offset()");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
wb_set_offset(struct archive_write *a, int64_t off)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
	int64_t used, ext_bytes;

	if (iso9660->wbuff_type != WB_TO_TEMP) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal Programing error: iso9660:wb_set_offset()");
		return (ARCHIVE_FATAL);
	}

	used = sizeof(iso9660->wbuff) - iso9660->wbuff_remaining;
	if (iso9660->wbuff_offset + used > iso9660->wbuff_tail)
		iso9660->wbuff_tail = iso9660->wbuff_offset + used;
	if (iso9660->wbuff_offset < iso9660->wbuff_written) {
		if (used > 0 &&
		    write_to_temp(a, iso9660->wbuff, (size_t)used) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		iso9660->wbuff_offset = iso9660->wbuff_written;
		lseek(iso9660->temp_fd, iso9660->wbuff_offset, SEEK_SET);
		iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
		used = 0;
	}
	if (off < iso9660->wbuff_offset) {
		/*
		 * Write out waiting data.
		 */
		if (used > 0) {
			if (wb_write_out(a) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}
		lseek(iso9660->temp_fd, off, SEEK_SET);
		iso9660->wbuff_offset = off;
		iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
	} else if (off <= iso9660->wbuff_tail) {
		iso9660->wbuff_remaining = (size_t)
		    (sizeof(iso9660->wbuff) - (off - iso9660->wbuff_offset));
	} else {
		ext_bytes = off - iso9660->wbuff_tail;
		iso9660->wbuff_remaining = (size_t)(sizeof(iso9660->wbuff)
		   - (iso9660->wbuff_tail - iso9660->wbuff_offset));
		while (ext_bytes >= (int64_t)iso9660->wbuff_remaining) {
			if (write_null(a, (size_t)iso9660->wbuff_remaining)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			ext_bytes -= iso9660->wbuff_remaining;
		}
		if (ext_bytes > 0) {
			if (write_null(a, (size_t)ext_bytes) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}
	}
	return (ARCHIVE_OK);
}